

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O2

string * __thiscall
smf::Options::getDefinition(string *__return_storage_ptr__,Options *this,string *optionName)

{
  iterator iVar1;
  allocator local_11;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->m_optionList)._M_t,optionName);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->m_optionList)._M_t._M_impl.super__Rb_tree_header)
  {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_11);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)
               (this->m_optionRegister).
               super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>.
               _M_impl.super__Vector_impl_data._M_start[(int)iVar1._M_node[2]._M_color]);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Options::getDefinition(const std::string& optionName) {
	auto it = m_optionList.find(optionName);
	if (it == m_optionList.end()) {
		return "";
	} else {
		return m_optionRegister[it->second]->getDefinition();
	}
}